

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O1

uint32_t __thiscall
GmmLib::GmmGen12CachePolicy::BestMatchingPATIdx
          (GmmGen12CachePolicy *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  Context *pCVar1;
  GMM_CACHE_POLICY_ELEMENT CachePolicy_00;
  undefined1 auVar2 [32];
  GMM_GFX_MEMORY_TYPE GVar3;
  GMM_PRIVATE_PAT *pGVar4;
  GMM_PRIVATE_PAT *pGVar5;
  uint32_t uVar6;
  undefined8 unaff_RBX;
  uint32_t uVar7;
  uint32_t PATIdx;
  
  pCVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext;
  auVar2 = CachePolicy._8_32_;
  CachePolicy_00._32_8_ = unaff_RBX;
  CachePolicy_00.IDCode = auVar2._0_4_;
  CachePolicy_00._4_4_ = auVar2._4_4_;
  CachePolicy_00.field_1 = (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)auVar2._8_8_;
  CachePolicy_00.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)auVar2._16_4_;
  CachePolicy_00.field_3 = (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)auVar2._20_4_
  ;
  CachePolicy_00.PTE = (GMM_PTE_CACHE_CONTROL_BITS)auVar2._24_8_;
  GVar3 = GmmCachePolicyCommon::GetWantedMemoryType((GmmCachePolicyCommon *)this,CachePolicy_00);
  PATIdx = 0;
  if (((pCVar1->WaTable).field_0x7 & 0x80) != 0) {
    GVar3 = GMM_GFX_UC_WITH_FENCE;
  }
  if (1 < (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.NumPATRegisters) {
    uVar7 = 1;
    do {
      pGVar4 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,PATIdx);
      pGVar5 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,uVar7);
      uVar6 = PATIdx;
      if (((ulong)pGVar5 & 3) == 0) {
        uVar6 = uVar7;
      }
      if (((GMM_GFX_MEMORY_TYPE)pGVar5 & GMM_GFX_WB) == GVar3) {
        uVar6 = uVar7;
      }
      if (((GMM_GFX_MEMORY_TYPE)pGVar4 & GMM_GFX_WB) != GVar3) {
        PATIdx = uVar6;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                     super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
                     NumPATRegisters);
  }
  pGVar4 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,PATIdx);
  uVar7 = 0xffffffff;
  if (((GMM_GFX_MEMORY_TYPE)pGVar4 & GMM_GFX_WB) == GVar3) {
    uVar7 = PATIdx;
  }
  return uVar7;
}

Assistant:

uint32_t GmmLib::GmmGen12CachePolicy::BestMatchingPATIdx(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    uint32_t            i;
    uint32_t            PATIdx           = 0;
    GMM_GFX_MEMORY_TYPE WantedMemoryType = GMM_GFX_UC_WITH_FENCE, MemoryType;
    WA_TABLE *          pWaTable         = &const_cast<WA_TABLE &>(pGmmLibContext->GetWaTable());

    WantedMemoryType = GetWantedMemoryType(CachePolicy);

    // Override wantedMemoryType so that PAT.MT is UC
    // Gen12 uses max function to resolve PAT-vs-MOCS MemType, So unless PTE.PAT says UC, MOCS won't be able to set UC!
    if(pWaTable->WaMemTypeIsMaxOfPatAndMocs)
    {
        WantedMemoryType = GMM_GFX_UC_WITH_FENCE;
    }

    for(i = 1; i < NumPATRegisters; i++)
    {
        GMM_PRIVATE_PAT PAT1 = GetPrivatePATEntry(PATIdx);
        GMM_PRIVATE_PAT PAT2 = GetPrivatePATEntry(i);

        if(SelectNewPATIdx(WantedMemoryType,
                           (GMM_GFX_MEMORY_TYPE)PAT1.Gen12.MemoryType,
                           (GMM_GFX_MEMORY_TYPE)PAT2.Gen12.MemoryType))
        {
            PATIdx = i;
        }
    }

    MemoryType = (GMM_GFX_MEMORY_TYPE)GetPrivatePATEntry(PATIdx).Gen12.MemoryType;

    if(MemoryType != WantedMemoryType)
    {
        // Failed to find a matching PAT entry
        return GMM_PAT_ERROR;
    }
    return PATIdx;
}